

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O1

void __thiscall
ExampleNLFeeder::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SuffixWriterFactory>
          (ExampleNLFeeder *this,SuffixWriterFactory *swf)

{
  uint uVar1;
  ExampleModel *pEVar2;
  double *pdVar3;
  uint uVar4;
  SuffixIntWriter sw;
  SparseVectorWriter<int,_int> local_28;
  
  pEVar2 = this->mdl_;
  uVar1 = pEVar2->suf[0].kind_;
  if ((uVar1 & 4) == 0) {
    uVar4 = 0;
    for (pdVar3 = pEVar2->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pEVar2->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3; pdVar3 = pdVar3 + 1) {
      uVar4 = uVar4 + (*pdVar3 != 0.0);
    }
    if (uVar4 != 0) {
      mp::TextFormatter::apr
                (&swf->nlw_->super_FormatterType,&swf->nlw_->nm,"S%d %d %s\n",(ulong)uVar1,
                 (ulong)uVar4,pEVar2->suf[0].name_);
    }
    local_28.p_nlw_ = swf->nlw_;
    local_28.n_entries_ = (size_t)(int)uVar4;
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,int>,std::vector<double,std::allocator<double>>>
              (this,&local_28,&this->mdl_->suf[0].values_);
  }
  else {
    uVar4 = 0;
    for (pdVar3 = pEVar2->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pEVar2->suf[0].values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3; pdVar3 = pdVar3 + 1) {
      uVar4 = uVar4 + (*pdVar3 != 0.0);
    }
    if (uVar4 != 0) {
      mp::TextFormatter::apr
                (&swf->nlw_->super_FormatterType,&swf->nlw_->nm,"S%d %d %s\n",(ulong)uVar1,
                 (ulong)uVar4,pEVar2->suf[0].name_);
    }
    local_28.p_nlw_ = swf->nlw_;
    local_28.n_entries_ = (size_t)(int)uVar4;
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,std::vector<double,std::allocator<double>>>
              (this,(SparseVectorWriter<int,_double> *)&local_28,&this->mdl_->suf[0].values_);
  }
  return;
}

Assistant:

void FeedSuffixes(SuffixWriterFactory& swf) {
    for (int i=0; i<Model().n_suf; ++i) {
      if (Model().suf[i].kind_ & 4) {     // double's
        auto sw = swf.StartDblSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      } else {                            // int's
        auto sw = swf.StartIntSuffix(
              Model().suf[i].name_,
              Model().suf[i].kind_,
              CountNNZ(Model().suf[i].values_));
        WriteDense2Sparse_Pure(sw, Model().suf[i].values_);
      }
    }
  }